

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int TestXmmRegEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                      _func_int_uchar_ptr_x86XmmReg_x86Reg *fun)

{
  x86XmmReg reg1;
  x86Reg reg2;
  int iVar1;
  long lVar2;
  uchar *puVar3;
  long lVar4;
  int local_48;
  
  puVar3 = stream;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    reg1 = testXmmRegs[lVar2];
    for (lVar4 = 0; lVar4 != 0x24; lVar4 = lVar4 + 4) {
      reg2 = *(x86Reg *)((long)testRegs + lVar4);
      EMIT_OP_REG_REG(ctx,op,reg1,reg2);
      iVar1 = (*fun)(puVar3,reg1,reg2);
      puVar3 = puVar3 + iVar1;
    }
  }
  local_48 = (int)stream;
  return (int)puVar3 - local_48;
}

Assistant:

int TestXmmRegEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86XmmReg dst, x86Reg src))
{
	unsigned char *start = stream;

	for(unsigned xmm = 0; xmm < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm++)
	{
		for(unsigned reg = 0; reg < sizeof(testRegs) / sizeof(testRegs[0]); reg++)
		{
			EMIT_OP_REG_REG(ctx, op, testXmmRegs[xmm], testRegs[reg]);
			stream += fun(stream, testXmmRegs[xmm], testRegs[reg]);
		}
	}

	return int(stream - start);
}